

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGeneratorMocUic.cxx
# Opt level: O3

void __thiscall cmQtAutoGeneratorMocUic::SettingsFileRead(cmQtAutoGeneratorMocUic *this)

{
  FileSystem *this_00;
  size_t sVar1;
  _Alloc_hider _Var2;
  bool bVar3;
  int iVar4;
  _Base_ptr p_Var5;
  _Rb_tree_header *p_Var6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  bool bVar8;
  string str;
  string sep;
  cmCryptoHash crypt;
  string local_a8;
  string local_88;
  string local_68;
  cmCryptoHash local_48;
  cmQtAutoGeneratorMocUic *local_38;
  
  cmCryptoHash::cmCryptoHash(&local_48,AlgoSHA256);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68," ~~~ ","");
  if ((this->Moc_).Enabled == true) {
    local_a8._M_string_length = 0;
    local_a8.field_2._M_local_buf[0] = '\0';
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    std::__cxx11::string::_M_append
              ((char *)&local_a8,(ulong)(this->Moc_).Executable._M_dataplus._M_p);
    std::__cxx11::string::_M_append((char *)&local_a8,(ulong)local_68._M_dataplus._M_p);
    cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&local_88,&(this->Moc_).AllOptions,";");
    std::__cxx11::string::_M_append((char *)&local_a8,(ulong)local_88._M_dataplus._M_p);
    paVar7 = &local_88.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != paVar7) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::_M_append((char *)&local_a8,(ulong)local_68._M_dataplus._M_p);
    std::__cxx11::string::append((char *)&local_a8);
    std::__cxx11::string::_M_append((char *)&local_a8,(ulong)local_68._M_dataplus._M_p);
    cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&local_88,&(this->Moc_).PredefsCmd,";");
    std::__cxx11::string::_M_append((char *)&local_a8,(ulong)local_88._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != paVar7) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::_M_append((char *)&local_a8,(ulong)local_68._M_dataplus._M_p);
    cmCryptoHash::HashString(&local_88,&local_48,&local_a8);
    std::__cxx11::string::operator=((string *)&this->SettingsStringMoc_,(string *)&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != paVar7) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,
                      CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                               local_a8.field_2._M_local_buf[0]) + 1);
    }
  }
  if ((this->Uic_).Enabled == true) {
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    local_a8._M_string_length = 0;
    local_a8.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::_M_append
              ((char *)&local_a8,(ulong)(this->Uic_).Executable._M_dataplus._M_p);
    std::__cxx11::string::_M_append((char *)&local_a8,(ulong)local_68._M_dataplus._M_p);
    cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&local_88,&(this->Uic_).TargetOptions,";");
    std::__cxx11::string::_M_append((char *)&local_a8,(ulong)local_88._M_dataplus._M_p);
    paVar7 = &local_88.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != paVar7) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    p_Var5 = (this->Uic_).Options._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var6 = &(this->Uic_).Options._M_t._M_impl.super__Rb_tree_header;
    local_38 = this;
    if ((_Rb_tree_header *)p_Var5 != p_Var6) {
      do {
        std::__cxx11::string::_M_append((char *)&local_a8,(ulong)local_68._M_dataplus._M_p);
        std::__cxx11::string::_M_append((char *)&local_a8,*(ulong *)(p_Var5 + 1));
        std::__cxx11::string::_M_append((char *)&local_a8,(ulong)local_68._M_dataplus._M_p);
        cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  (&local_88,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(p_Var5 + 2),";");
        std::__cxx11::string::_M_append((char *)&local_a8,(ulong)local_88._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != paVar7) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
        }
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
      } while ((_Rb_tree_header *)p_Var5 != p_Var6);
    }
    std::__cxx11::string::_M_append((char *)&local_a8,(ulong)local_68._M_dataplus._M_p);
    this = local_38;
    cmCryptoHash::HashString(&local_88,&local_48,&local_a8);
    std::__cxx11::string::operator=((string *)&this->SettingsStringUic_,(string *)&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != paVar7) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,
                      CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                               local_a8.field_2._M_local_buf[0]) + 1);
    }
  }
  paVar7 = &local_68.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar7) {
    operator_delete(local_68._M_dataplus._M_p,
                    CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                             local_68.field_2._M_local_buf[0]) + 1);
  }
  cmCryptoHash::~cmCryptoHash(&local_48);
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  this_00 = &(this->super_cmQtAutoGenerator).FileSys_;
  local_68._M_dataplus._M_p = (pointer)paVar7;
  bVar3 = cmQtAutoGenerator::FileSystem::FileRead
                    (this_00,&local_68,&this->SettingsFile_,(string *)0x0);
  bVar8 = (this->Moc_).Enabled;
  if (bVar3) {
    if (bVar8 != false) {
      cmQtAutoGenerator::SettingsFind(&local_a8,&local_68,"moc");
      _Var2._M_p = local_a8._M_dataplus._M_p;
      sVar1 = (this->SettingsStringMoc_)._M_string_length;
      if (sVar1 == local_a8._M_string_length) {
        if (sVar1 == 0) {
          bVar8 = false;
        }
        else {
          iVar4 = bcmp((this->SettingsStringMoc_)._M_dataplus._M_p,local_a8._M_dataplus._M_p,sVar1);
          bVar8 = iVar4 != 0;
        }
      }
      else {
        bVar8 = true;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var2._M_p != &local_a8.field_2) {
        operator_delete(_Var2._M_p,
                        CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                                 local_a8.field_2._M_local_buf[0]) + 1);
      }
      if (bVar8) {
        (this->Moc_).SettingsChanged = true;
      }
    }
    if ((this->Uic_).Enabled == true) {
      cmQtAutoGenerator::SettingsFind(&local_a8,&local_68,"uic");
      _Var2._M_p = local_a8._M_dataplus._M_p;
      sVar1 = (this->SettingsStringUic_)._M_string_length;
      if (sVar1 == local_a8._M_string_length) {
        if (sVar1 == 0) {
          bVar8 = false;
        }
        else {
          iVar4 = bcmp((this->SettingsStringUic_)._M_dataplus._M_p,local_a8._M_dataplus._M_p,sVar1);
          bVar8 = iVar4 != 0;
        }
      }
      else {
        bVar8 = true;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var2._M_p != &local_a8.field_2) {
        operator_delete(_Var2._M_p,
                        CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                                 local_a8.field_2._M_local_buf[0]) + 1);
      }
      if (bVar8) {
        (this->Uic_).SettingsChanged = true;
      }
    }
    if (((this->Moc_).SettingsChanged != false) || ((this->Uic_).SettingsChanged == true)) {
      cmQtAutoGenerator::FileSystem::FileRemove(this_00,&this->SettingsFile_);
    }
  }
  else {
    if (bVar8 != false) {
      (this->Moc_).SettingsChanged = true;
    }
    if ((this->Uic_).Enabled == true) {
      (this->Uic_).SettingsChanged = true;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar7) {
    operator_delete(local_68._M_dataplus._M_p,
                    CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                             local_68.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void cmQtAutoGeneratorMocUic::SettingsFileRead()
{
  // Compose current settings strings
  {
    cmCryptoHash crypt(cmCryptoHash::AlgoSHA256);
    std::string const sep(" ~~~ ");
    if (Moc_.Enabled) {
      std::string str;
      str += Moc().Executable;
      str += sep;
      str += cmJoin(Moc().AllOptions, ";");
      str += sep;
      str += Base().IncludeProjectDirsBefore ? "TRUE" : "FALSE";
      str += sep;
      str += cmJoin(Moc().PredefsCmd, ";");
      str += sep;
      SettingsStringMoc_ = crypt.HashString(str);
    }
    if (Uic().Enabled) {
      std::string str;
      str += Uic().Executable;
      str += sep;
      str += cmJoin(Uic().TargetOptions, ";");
      for (const auto& item : Uic().Options) {
        str += sep;
        str += item.first;
        str += sep;
        str += cmJoin(item.second, ";");
      }
      str += sep;
      SettingsStringUic_ = crypt.HashString(str);
    }
  }

  // Read old settings and compare
  {
    std::string content;
    if (FileSys().FileRead(content, SettingsFile_)) {
      if (Moc().Enabled) {
        if (SettingsStringMoc_ != SettingsFind(content, "moc")) {
          Moc_.SettingsChanged = true;
        }
      }
      if (Uic().Enabled) {
        if (SettingsStringUic_ != SettingsFind(content, "uic")) {
          Uic_.SettingsChanged = true;
        }
      }
      // In case any setting changed remove the old settings file.
      // This triggers a full rebuild on the next run if the current
      // build is aborted before writing the current settings in the end.
      if (Moc().SettingsChanged || Uic().SettingsChanged) {
        FileSys().FileRemove(SettingsFile_);
      }
    } else {
      // Settings file read failed
      if (Moc().Enabled) {
        Moc_.SettingsChanged = true;
      }
      if (Uic().Enabled) {
        Uic_.SettingsChanged = true;
      }
    }
  }
}